

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O0

vx_mesh_t *
vx_voxelize(vx_mesh_t *m,float voxelsizex,float voxelsizey,float voxelsizez,float precision)

{
  vx_aabb_t *a;
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  vx_triangle_t triangle_00;
  vx_vertex_t pos;
  vx_vertex_t boxcenter_00;
  bool bVar5;
  int iVar6;
  vx_hash_table_t *table_00;
  undefined8 *data;
  size_t hash_00;
  vx_mesh_t *mesh;
  vx_vertex_t *pvVar7;
  uint *puVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  vx_vertex_t vVar13;
  vx_vertex_t *p;
  vx_hash_table_node_t *node;
  size_t i_1;
  float vertices [24];
  size_t nindices;
  size_t nvertices;
  bool insert;
  size_t hash;
  vx_vertex_t *nodedata;
  float local_e0;
  undefined8 local_d8;
  vx_vertex_t halfsize;
  float local_c0;
  vx_vertex_t boxcenter;
  vx_aabb_t saabb;
  float z;
  float y;
  float x;
  vx_aabb_t aabb;
  vx_triangle_t triangle;
  int i;
  float halfsizez;
  float halfsizey;
  float halfsizex;
  size_t voxels;
  vx_hash_table_t *table;
  vx_mesh_t *outmesh;
  float precision_local;
  float voxelsizez_local;
  float voxelsizey_local;
  float voxelsizex_local;
  vx_mesh_t *m_local;
  
  _halfsizey = 0;
  fVar9 = voxelsizex * 0.5;
  fVar10 = voxelsizey * 0.5;
  fVar11 = voxelsizez * 0.5;
  table_00 = vx__hash_table_alloc(0x1000);
  for (triangle.p3.field_0.v[1] = 0.0; (ulong)(long)(int)triangle.p3.field_0.v[1] < m->nindices;
      triangle.p3.field_0.v[1] = (float)((int)triangle.p3.field_0.v[1] + 3)) {
    aabb.max.field_0._4_8_ =
         *(undefined8 *)&m->vertices[m->indices[(int)triangle.p3.field_0.v[1]]].field_0;
    fVar1 = m->vertices[m->indices[(int)triangle.p3.field_0.v[1]]].field_0.v[2];
    uVar4 = *(undefined8 *)&m->vertices[m->indices[(int)triangle.p3.field_0.v[1] + 1]].field_0;
    triangle.p1.field_0.v[1] = (float)uVar4;
    triangle.p1.field_0.v[2] = (float)((ulong)uVar4 >> 0x20);
    fVar2 = m->vertices[m->indices[(int)triangle.p3.field_0.v[1] + 1]].field_0.v[2];
    uVar4 = *(undefined8 *)&m->vertices[m->indices[(int)triangle.p3.field_0.v[1] + 2]].field_0;
    fVar3 = m->vertices[m->indices[(int)triangle.p3.field_0.v[1] + 2]].field_0.v[2];
    fVar12 = vx__triangle_area((vx_triangle_t *)((long)&aabb.max.field_0 + 4));
    if (1e-07 <= fVar12) {
      vx__triangle_aabb((vx_aabb_t *)&y,(vx_triangle_t *)((long)&aabb.max.field_0 + 4));
      y = vx__map_to_voxel(y,voxelsizex,true);
      x = vx__map_to_voxel(x,voxelsizey,true);
      aabb.min.field_0.v[0] = vx__map_to_voxel(aabb.min.field_0.v[0],voxelsizez,true);
      aabb.min.field_0.v[1] = vx__map_to_voxel(aabb.min.field_0.v[1],voxelsizex,false);
      aabb.min.field_0.v[2] = vx__map_to_voxel(aabb.min.field_0.v[2],voxelsizey,false);
      aabb.max.field_0.v[0] = vx__map_to_voxel(aabb.max.field_0.v[0],voxelsizez,false);
      for (z = y; z < aabb.min.field_0.v[1]; z = voxelsizex + z) {
        for (saabb.max.field_0.v[2] = x; saabb.max.field_0.v[2] < aabb.min.field_0.v[2];
            saabb.max.field_0.v[2] = voxelsizey + saabb.max.field_0.v[2]) {
          for (saabb.max.field_0.v[1] = aabb.min.field_0.v[0];
              saabb.max.field_0.v[1] < aabb.max.field_0.v[0];
              saabb.max.field_0.v[1] = voxelsizez + saabb.max.field_0.v[1]) {
            boxcenter.field_0.v[2] = z - fVar9;
            a = (vx_aabb_t *)((long)&boxcenter.field_0 + 8);
            vVar13 = vx__aabb_center(a);
            local_c0 = vVar13.field_0._8_4_;
            boxcenter.field_0.v[0] = local_c0;
            stack0xffffffffffffff38 = vVar13.field_0._0_8_;
            vVar13 = vx__aabb_half_size(a);
            local_e0 = vVar13.field_0._8_4_;
            local_d8._0_4_ = vVar13.field_0._0_4_;
            local_d8._4_4_ = vVar13.field_0._4_4_;
            local_d8 = CONCAT44(local_d8._4_4_ + precision,(float)local_d8 + precision);
            triangle_00.p2.field_0.v[0] = triangle.p1.field_0.v[1];
            triangle_00.p1.field_0.v[2] = fVar1;
            triangle_00.p2.field_0.v[2] = fVar2;
            triangle_00.p2.field_0.v[1] = triangle.p1.field_0.v[2];
            boxcenter_00.field_0.v[2] = boxcenter.field_0.v[0];
            boxcenter_00.field_0._0_8_ = stack0xffffffffffffff38;
            vVar13.field_0.v[2] = local_e0 + precision;
            vVar13.field_0._0_8_ = local_d8;
            triangle_00.p1.field_0._0_8_ = aabb.max.field_0._4_8_;
            triangle_00.p3.field_0._0_8_ = uVar4;
            triangle_00.p3.field_0.v[2] = fVar3;
            iVar6 = vx__triangle_box_overlap(boxcenter_00,vVar13,triangle_00);
            if (iVar6 != 0) {
              data = (undefined8 *)malloc(0xc);
              *(float *)(data + 1) = boxcenter.field_0.v[0];
              *data = stack0xffffffffffffff38;
              pos.field_0.v[2] = boxcenter.field_0.v[0];
              pos.field_0._0_8_ = stack0xffffffffffffff38;
              hash_00 = vx__vertex_hash(pos,0x1000);
              bVar5 = vx__hash_table_insert(table_00,hash_00,data,vx__vertex_comp_func);
              if (bVar5) {
                _halfsizey = _halfsizey + 1;
              }
            }
          }
        }
      }
    }
  }
  mesh = (vx_mesh_t *)malloc(0x38);
  mesh->nnormals = 6;
  pvVar7 = (vx_vertex_t *)calloc(_halfsizey * 0x60,1);
  mesh->vertices = pvVar7;
  pvVar7 = (vx_vertex_t *)calloc(0x48,1);
  mesh->normals = pvVar7;
  puVar8 = (uint *)calloc(_halfsizey * 0x90,1);
  mesh->indices = puVar8;
  puVar8 = (uint *)calloc(_halfsizey * 0x90,1);
  mesh->normalindices = puVar8;
  mesh->nindices = 0;
  mesh->nvertices = 0;
  memcpy(mesh->normals,vx_normals,0x48);
  i_1._0_4_ = -fVar9;
  vertices[1] = -fVar9;
  vertices[2] = -fVar10;
  vertices[5] = -fVar10;
  vertices[10] = -fVar9;
  vertices[0xc] = -fVar11;
  vertices[0xd] = -fVar9;
  vertices[0xe] = -fVar10;
  vertices[0xf] = -fVar11;
  vertices[0x11] = -fVar10;
  vertices[0x12] = -fVar11;
  vertices[0x15] = -fVar11;
  i_1._4_4_ = fVar10;
  vertices[0] = fVar11;
  vertices[3] = fVar11;
  vertices[4] = fVar9;
  vertices[6] = fVar11;
  vertices[7] = fVar9;
  vertices[8] = fVar10;
  vertices[9] = fVar11;
  vertices[0xb] = fVar10;
  vertices[0x10] = fVar9;
  vertices[0x13] = fVar9;
  vertices[0x14] = fVar10;
  for (node = (vx_hash_table_node_t *)0x0; node < (vx_hash_table_node_t *)table_00->size;
      node = (vx_hash_table_node_t *)((long)&node->next + 1)) {
    if ((table_00->elements[(long)node] != (vx_hash_table_node_t *)0x0) &&
       (p = (vx_vertex_t *)table_00->elements[(long)node],
       (vx_hash_table_node_t *)p != (vx_hash_table_node_t *)0x0)) {
      vx__add_voxel(mesh,(vx_vertex_t *)((vx_hash_table_node_t *)p)->data,(float *)&i_1);
      while (*(long *)&p->field_0 != 0) {
        p = *(vx_vertex_t **)&p->field_0;
        vx__add_voxel(mesh,*(vx_vertex_t **)((long)&p[1].field_0 + 4),(float *)&i_1);
      }
    }
  }
  vx__hash_table_free(table_00,true);
  return mesh;
}

Assistant:

vx_mesh_t* vx_voxelize(vx_mesh_t* m,
    float voxelsizex,
    float voxelsizey,
    float voxelsizez,
    float precision)
{
    vx_mesh_t* outmesh = NULL;
    vx_hash_table_t* table = NULL;
    size_t voxels = 0;

    float halfsizex = voxelsizex * 0.5f;
    float halfsizey = voxelsizey * 0.5f;
    float halfsizez = voxelsizez * 0.5f;

    table = vx__hash_table_alloc(VOXELIZER_HASH_TABLE_SIZE);

    for (int i = 0; i < m->nindices; i += 3) {
        vx_triangle_t triangle;

        VX_ASSERT(m->indices[i+0] < m->nvertices);
        VX_ASSERT(m->indices[i+1] < m->nvertices);
        VX_ASSERT(m->indices[i+2] < m->nvertices);

        triangle.p1 = m->vertices[m->indices[i+0]];
        triangle.p2 = m->vertices[m->indices[i+1]];
        triangle.p3 = m->vertices[m->indices[i+2]];

        if (vx__triangle_area(&triangle) < VOXELIZER_EPSILON) {
            // triangle with 0 area
            continue;
        }

        vx_aabb_t aabb = vx__triangle_aabb(&triangle);

        aabb.min.x = vx__map_to_voxel(aabb.min.x, voxelsizex, true);
        aabb.min.y = vx__map_to_voxel(aabb.min.y, voxelsizey, true);
        aabb.min.z = vx__map_to_voxel(aabb.min.z, voxelsizez, true);

        aabb.max.x = vx__map_to_voxel(aabb.max.x, voxelsizex, false);
        aabb.max.y = vx__map_to_voxel(aabb.max.y, voxelsizey, false);
        aabb.max.z = vx__map_to_voxel(aabb.max.z, voxelsizez, false);

        for (float x = aabb.min.x; x < aabb.max.x; x += voxelsizex) {
            for (float y = aabb.min.y; y < aabb.max.y; y += voxelsizey) {
                for (float z = aabb.min.z; z < aabb.max.z; z += voxelsizez) {
                    vx_aabb_t saabb;

                    saabb.min.x = x - halfsizex;
                    saabb.min.y = y - halfsizey;
                    saabb.min.z = z - halfsizez;
                    saabb.max.x = x + halfsizex;
                    saabb.max.y = y + halfsizey;
                    saabb.max.z = z + halfsizez;

                    vx_vertex_t boxcenter = vx__aabb_center(&saabb);
                    vx_vertex_t halfsize = vx__aabb_half_size(&saabb);

                    // HACK: some holes might appear, this
                    // precision factor reduces the artifact
                    halfsize.x += precision;
                    halfsize.y += precision;
                    halfsize.z += precision;

                    if (vx__triangle_box_overlap(boxcenter, halfsize, triangle)) {
                        vx_vertex_t* nodedata = VX_MALLOC(vx_vertex_t, 1);
                        *nodedata = boxcenter;

                        size_t hash = vx__vertex_hash(boxcenter, VOXELIZER_HASH_TABLE_SIZE);

                        bool insert = vx__hash_table_insert(table,
                                hash,
                                nodedata,
                                vx__vertex_comp_func);

                        if (insert) {
                            voxels++;
                        }
                   }
                }
            }
        }
    }

    outmesh = VX_MALLOC(vx_mesh_t, 1);
    size_t nvertices = voxels * 8;
    size_t nindices = voxels * VOXELIZER_INDICES_SIZE;
    outmesh->nnormals = VOXELIZER_NORMAL_INDICES_SIZE;
    outmesh->vertices = VX_CALLOC(vx_vertex_t, nvertices);
    outmesh->normals = VX_CALLOC(vx_vertex_t, 6);
    outmesh->indices = VX_CALLOC(unsigned int, nindices);
    outmesh->normalindices = VX_CALLOC(unsigned int, nindices);
    outmesh->nindices = 0;
    outmesh->nvertices = 0;

    memcpy(outmesh->normals, vx_normals, 18 * sizeof(float));

    float vertices[24] = {
        -halfsizex,  halfsizey,  halfsizez,
        -halfsizex, -halfsizey,  halfsizez,
         halfsizex, -halfsizey,  halfsizez,
         halfsizex,  halfsizey,  halfsizez,
        -halfsizex,  halfsizey, -halfsizez,
        -halfsizex, -halfsizey, -halfsizez,
         halfsizex, -halfsizey, -halfsizez,
         halfsizex,  halfsizey, -halfsizez,
    };

    for (size_t i = 0; i < table->size; ++i) {
        if (table->elements[i] != NULL) {
            vx_hash_table_node_t* node = table->elements[i];

            if (!node) {
                continue;
            }

            vx_vertex_t* p = (vx_vertex_t*) node->data;
            vx__add_voxel(outmesh, p, vertices);

            while (node->next) {
                node = node->next;
                p = (vx_vertex_t*) node->data;
                vx__add_voxel(outmesh, p, vertices);
            }
        }
    }

    vx__hash_table_free(table, true);

    return outmesh;
}